

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall Sampling_TrimmedExponential_Test::TestBody(Sampling_TrimmedExponential_Test *this)

{
  span<const_float> f;
  bool bVar1;
  int iVar2;
  Float FVar3;
  Float FVar4;
  float fVar5;
  AssertionResult gtest_ar_;
  anon_class_1_0_00000001 checkErr;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Float dx;
  Float dp;
  Float cp;
  Float cx;
  Float u;
  Uniform1DIter __end2;
  Uniform1DIter __begin2;
  Uniform1D *__range2;
  PiecewiseConstant1D distrib;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> values;
  anon_class_8_1_54a39803 exp;
  Float xMax;
  Float c;
  Float *p;
  Float (*__end1) [3];
  Float (*__begin1) [3];
  Float (*__range1) [3] [3];
  Float params [3] [3];
  Float in_stack_fffffffffffffce8;
  Float in_stack_fffffffffffffcec;
  PiecewiseConstant1D *in_stack_fffffffffffffcf0;
  Float in_stack_fffffffffffffcf8;
  Float in_stack_fffffffffffffcfc;
  function<float_(float)> *in_stack_fffffffffffffd00;
  Message *in_stack_fffffffffffffd08;
  Message *in_stack_fffffffffffffd10;
  Message *in_stack_fffffffffffffd18;
  AssertHelper *in_stack_fffffffffffffd20;
  undefined6 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2e;
  undefined1 in_stack_fffffffffffffd2f;
  Float in_stack_fffffffffffffd30;
  Float in_stack_fffffffffffffd34;
  char *in_stack_fffffffffffffd38;
  PiecewiseConstant1D *in_stack_fffffffffffffd40;
  Message *in_stack_fffffffffffffd50;
  Message *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  AssertionResult *in_stack_fffffffffffffd68;
  AssertHelper *in_stack_fffffffffffffd70;
  Message *in_stack_fffffffffffffd78;
  function<float_(float)> *in_stack_fffffffffffffd80;
  Allocator in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 uVar6;
  char *expr2;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 uVar7;
  string local_240 [44];
  Float local_214;
  Float in_stack_fffffffffffffe00;
  Float in_stack_fffffffffffffe04;
  PiecewiseConstant1D *in_stack_fffffffffffffe08;
  Allocator in_stack_fffffffffffffe10;
  float *in_stack_fffffffffffffe18;
  size_t in_stack_fffffffffffffe20;
  AssertionResult local_1d0 [2];
  undefined8 local_1b0;
  float local_1a4;
  AssertionResult local_1a0;
  Float local_18c;
  float local_188;
  Float local_184;
  Float local_180;
  Float local_17c;
  IndexingIterator<pbrt::detail::Uniform1DIter> local_160 [3];
  undefined1 local_148 [24];
  undefined1 *local_130;
  undefined1 local_110 [104];
  char local_a8 [64];
  undefined4 *local_68;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 *local_58;
  undefined4 *local_50;
  undefined4 *local_48;
  undefined4 *local_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 auStack_14 [5];
  
  memset(&local_38,0,0x24);
  local_38 = 0x3f800000;
  local_34 = 0x40000000;
  local_2c = 0x40a00000;
  local_28 = 0x41200000;
  local_20 = 0x3e800000;
  local_1c = 0x41a00000;
  local_50 = auStack_14;
  local_48 = &local_38;
  local_40 = local_48;
  for (; local_48 != local_50; local_48 = local_48 + 3) {
    local_58 = local_48;
    local_5c = *local_48;
    local_60 = local_48[1];
    local_68 = &local_5c;
    expr2 = local_a8;
    std::function<float(float)>::function<Sampling_TrimmedExponential_Test::TestBody()::__0&,void>
              (in_stack_fffffffffffffd00,
               (anon_class_8_1_54a39803 *)
               CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    uVar7 = local_60;
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffcf0);
    pbrt::Sample1DFunction
              (in_stack_fffffffffffffd80,(int)((ulong)in_stack_fffffffffffffd78 >> 0x20),
               (int)in_stack_fffffffffffffd78,(Float)((ulong)in_stack_fffffffffffffd70 >> 0x20),
               SUB84(in_stack_fffffffffffffd70,0),in_stack_fffffffffffffd88);
    std::function<float_(float)>::~function((function<float_(float)> *)0x6423ad);
    pstd::span<float_const>::
    span<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,void,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
              ((span<const_float> *)in_stack_fffffffffffffd00,
               (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    uVar6 = local_60;
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffcf0);
    f.n = in_stack_fffffffffffffe20;
    f.ptr = in_stack_fffffffffffffe18;
    pbrt::PiecewiseConstant1D::PiecewiseConstant1D
              (in_stack_fffffffffffffe08,f,in_stack_fffffffffffffe04,in_stack_fffffffffffffe00,
               in_stack_fffffffffffffe10);
    pbrt::Uniform1D::RNGGenerator
              ((Uniform1D *)in_stack_fffffffffffffd00,(int)in_stack_fffffffffffffcfc,
               (uint64_t)in_stack_fffffffffffffcf0,
               CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    local_130 = local_148;
    pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::begin
              ((IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)
               in_stack_fffffffffffffcf0);
    pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::end
              ((IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> *)
               in_stack_fffffffffffffcf0);
    while( true ) {
      bVar1 = pbrt::detail::IndexingIterator<pbrt::detail::Uniform1DIter>::operator!=
                        ((IndexingIterator<pbrt::detail::Uniform1DIter> *)in_stack_fffffffffffffcf0,
                         (Uniform1DIter *)
                         CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      in_stack_fffffffffffffda8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffda8);
      if (!bVar1) break;
      FVar3 = pbrt::detail::Uniform1DIter::operator*((Uniform1DIter *)0x6424b2);
      local_17c = FVar3;
      FVar4 = pbrt::SampleTrimmedExponential
                        ((Float)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                         SUB84(in_stack_fffffffffffffcf0,0),in_stack_fffffffffffffcec);
      local_180 = FVar4;
      local_184 = pbrt::TrimmedExponentialPDF
                            (SUB84(in_stack_fffffffffffffcf0,0),in_stack_fffffffffffffcec,
                             in_stack_fffffffffffffce8);
      iVar2 = (int)local_110;
      local_18c = pbrt::PiecewiseConstant1D::Sample
                            (in_stack_fffffffffffffd40,
                             (Float)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                             (Float *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                             (int *)CONCAT17(in_stack_fffffffffffffd2f,
                                             CONCAT16(in_stack_fffffffffffffd2e,
                                                      in_stack_fffffffffffffd28)));
      fVar5 = local_180 - local_18c;
      std::abs(iVar2);
      local_1b0 = 0x3f847ae147ae147b;
      local_1a4 = fVar5;
      testing::internal::CmpHelperLT<float,double>
                ((char *)CONCAT44(uVar7,in_stack_fffffffffffffdb8),expr2,
                 (float *)CONCAT44(uVar6,in_stack_fffffffffffffda8),(double *)CONCAT44(FVar3,FVar4))
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffd20);
        in_stack_fffffffffffffd88.memoryResource =
             (memory_resource *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcf0,
                        (char (*) [15])CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8)
                       );
        in_stack_fffffffffffffd80 =
             (function<float_(float)> *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcf0,
                        (float *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        in_stack_fffffffffffffd78 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcf0,
                        (char (*) [13])CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8)
                       );
        in_stack_fffffffffffffd70 =
             (AssertHelper *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcf0,
                        (float *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        in_stack_fffffffffffffd68 =
             (AssertionResult *)
             testing::AssertionResult::failure_message((AssertionResult *)0x64272e);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffd20,(Type)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                   (char *)in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20)
                   ,(char *)in_stack_fffffffffffffd00);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcf0);
        testing::Message::~Message((Message *)0x642791);
      }
      iVar2 = (int)&local_1a0;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x6427e9);
      fVar5 = local_184 - local_188;
      std::abs(iVar2);
      in_stack_fffffffffffffe20 = 0x3f847ae147ae147b;
      testing::internal::CmpHelperLT<float,double>
                ((char *)CONCAT44(uVar7,in_stack_fffffffffffffdb8),expr2,
                 (float *)CONCAT44(uVar6,in_stack_fffffffffffffda8),(double *)CONCAT44(FVar3,FVar4))
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d0);
      in_stack_fffffffffffffd60 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd60);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffd20);
        in_stack_fffffffffffffd58 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcf0,
                        (char (*) [19])CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8)
                       );
        in_stack_fffffffffffffd50 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcf0,
                        (float *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        testing::Message::operator<<
                  ((Message *)in_stack_fffffffffffffcf0,
                   (char (*) [17])CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        in_stack_fffffffffffffd40 =
             (PiecewiseConstant1D *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcf0,
                        (float *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        in_stack_fffffffffffffd38 =
             testing::AssertionResult::failure_message((AssertionResult *)0x642928);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffd20,(Type)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                   (char *)in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20)
                   ,(char *)in_stack_fffffffffffffd00);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcf0);
        testing::Message::~Message((Message *)0x642982);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x6429da);
      in_stack_fffffffffffffd30 = local_17c;
      in_stack_fffffffffffffd34 =
           pbrt::InvertTrimmedExponentialSample
                     ((Float)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                      SUB84(in_stack_fffffffffffffcf0,0),in_stack_fffffffffffffcec);
      in_stack_fffffffffffffd2f =
           TestBody::anon_class_1_0_00000001::operator()
                     ((anon_class_1_0_00000001 *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc
                      ,in_stack_fffffffffffffcf8);
      testing::AssertionResult::AssertionResult
                ((AssertionResult *)in_stack_fffffffffffffcf0,
                 SUB41((uint)in_stack_fffffffffffffcec >> 0x18,0));
      in_stack_fffffffffffffd2e =
           testing::AssertionResult::operator_cast_to_bool
                     ((AssertionResult *)&stack0xfffffffffffffdf8);
      if (!(bool)in_stack_fffffffffffffd2e) {
        testing::Message::Message((Message *)in_stack_fffffffffffffd20);
        in_stack_fffffffffffffd20 =
             (AssertHelper *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcf0,
                        (char (*) [5])CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8))
        ;
        in_stack_fffffffffffffd18 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcf0,
                        (float *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        in_stack_fffffffffffffd10 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcf0,
                        (char (*) [9])CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8))
        ;
        in_stack_fffffffffffffd08 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcf0,
                        (float *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        in_stack_fffffffffffffd00 =
             (function<float_(float)> *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcf0,
                        (char (*) [9])CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8))
        ;
        in_stack_fffffffffffffcfc =
             pbrt::InvertTrimmedExponentialSample
                       ((Float)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                        SUB84(in_stack_fffffffffffffcf0,0),in_stack_fffffffffffffcec);
        local_214 = in_stack_fffffffffffffcfc;
        in_stack_fffffffffffffcf0 =
             (PiecewiseConstant1D *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffcf0,
                        (float *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (in_stack_fffffffffffffd68,(char *)CONCAT44(fVar5,in_stack_fffffffffffffd60),
                   (char *)in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffd20,(Type)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                   (char *)in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20)
                   ,(char *)in_stack_fffffffffffffd00);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcf0);
        std::__cxx11::string::~string(local_240);
        testing::Message::~Message((Message *)0x642c0b);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x642c83);
      pbrt::detail::IndexingIterator<pbrt::detail::Uniform1DIter>::operator++(local_160);
    }
    pbrt::PiecewiseConstant1D::~PiecewiseConstant1D(in_stack_fffffffffffffcf0);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              (&in_stack_fffffffffffffcf0->func);
  }
  return;
}

Assistant:

TEST(Sampling, TrimmedExponential) {
    Float params[][3] = {{1., 2.}, {5, 10}, {.25, 20}};
    for (const auto p : params) {
        Float c = p[0], xMax = p[1];
        auto exp = [&](Float x) { return std::exp(-c * x); };

        auto values = Sample1DFunction(exp, 32768, 16, 0, xMax);
        PiecewiseConstant1D distrib(values, 0, xMax);
        for (Float u : Uniform1D(100)) {
            Float cx = SampleTrimmedExponential(u, c, xMax);
            Float cp = TrimmedExponentialPDF(cx, c, xMax);

            Float dp;
            Float dx = distrib.Sample(u, &dp);
            EXPECT_LT(std::abs(cx - dx), 1e-2)
                << "Closed form = " << cx << ", distrib = " << dx;
            EXPECT_LT(std::abs(cp - dp), 1e-2)
                << "Closed form PDF = " << cp << ", distrib PDF = " << dp;

            auto checkErr = [](Float a, Float b) {
                Float err;
                if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                    err = std::abs(a - b);
                else
                    err = std::abs(2 * (a - b) / (a + b));
                return err > 1e-2;
            };
            EXPECT_FALSE(checkErr(u, InvertTrimmedExponentialSample(cx, c, xMax)))
                << "u = " << u << " -> x = " << cx << " -> ... "
                << InvertTrimmedExponentialSample(cx, c, xMax);
        }
    }
}